

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  ushort uVar1;
  U32 UVar2;
  char cVar3;
  uint uVar4;
  size_t sVar5;
  uint local_1f8;
  uint local_1f4;
  U32 n_4;
  U32 n_3;
  ushort local_1e8;
  U16 min;
  U32 n_2;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  uint local_1a0;
  U32 w;
  U32 n_1;
  U32 curr;
  U32 nextRankStart;
  U32 n;
  size_t readSize;
  HUF_CElt *ct;
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [13];
  byte local_138 [8];
  BYTE huffWeight [256];
  uint *hasZeroWeights_local;
  size_t srcSize_local;
  void *src_local;
  uint *maxSymbolValuePtr_local;
  HUF_CElt *CTable_local;
  
  ct._4_4_ = 0;
  ct._0_4_ = 0;
  huffWeight._248_8_ = hasZeroWeights;
  CTable_local = (HUF_CElt *)
                 HUF_readStats(local_138,0x100,&nbSymbols,(U32 *)&ct,(U32 *)((long)&ct + 4),src,
                               srcSize);
  uVar4 = ERR_isError((size_t)CTable_local);
  if (uVar4 == 0) {
    *(uint *)huffWeight._248_8_ = (uint)(nbSymbols != 0);
    if (ct._4_4_ < 0xd) {
      if (*maxSymbolValuePtr + 1 < (uint)ct) {
        CTable_local = (HUF_CElt *)0xffffffffffffffd0;
      }
      else {
        *CTable = (ulong)ct._4_4_;
        n_1 = 0;
        for (curr = 1; curr <= ct._4_4_; curr = curr + 1) {
          UVar2 = (&nbSymbols)[curr];
          cVar3 = (char)curr;
          (&nbSymbols)[curr] = n_1;
          n_1 = (UVar2 << (cVar3 - 1U & 0x1f)) + n_1;
        }
        for (local_1a0 = 0; local_1a0 < (uint)ct; local_1a0 = local_1a0 + 1) {
          HUF_setNbBits(CTable + (ulong)local_1a0 + 1,
                        (long)(int)((ct._4_4_ + 1) - (uint)local_138[local_1a0] & 0xff &
                                   -(uint)(local_138[local_1a0] != 0)));
        }
        memset(valPerRank + 0xc,0,0x1c);
        memset(&local_1e8,0,0x1c);
        for (n_3 = 0; n_3 < (uint)ct; n_3 = n_3 + 1) {
          sVar5 = HUF_getNbBits(CTable[(ulong)n_3 + 1]);
          valPerRank[sVar5 + 0xc] = valPerRank[sVar5 + 0xc] + 1;
        }
        (&local_1e8)[ct._4_4_ + 1] = 0;
        n_4._2_2_ = 0;
        for (local_1f4 = ct._4_4_; local_1f4 != 0; local_1f4 = local_1f4 - 1) {
          (&local_1e8)[local_1f4] = n_4._2_2_;
          n_4._2_2_ = (ushort)((int)(uint)(ushort)(n_4._2_2_ + valPerRank[(ulong)local_1f4 + 0xc])
                              >> 1);
        }
        for (local_1f8 = 0; local_1f8 < (uint)ct; local_1f8 = local_1f8 + 1) {
          sVar5 = HUF_getNbBits(CTable[(ulong)local_1f8 + 1]);
          uVar1 = (&local_1e8)[sVar5];
          (&local_1e8)[sVar5] = uVar1 + 1;
          HUF_setValue(CTable + (ulong)local_1f8 + 1,(ulong)uVar1);
        }
        *maxSymbolValuePtr = (uint)ct - 1;
      }
    }
    else {
      CTable_local = (HUF_CElt *)0xffffffffffffffd4;
    }
  }
  return (size_t)CTable_local;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    CTable[0] = tableLog;

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}